

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

QSize __thiscall QGridLayout::minimumSize(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  QSize QVar1;
  QSize QVar2;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  hSpacing = horizontalSpacing(this);
  vSpacing = verticalSpacing(this);
  QVar1 = QGridLayoutPrivate::minimumSize(this_00,hSpacing,vSpacing);
  QVar2.ht.m_i = QVar1.ht.m_i.m_i + this_00->topMargin + this_00->bottomMargin;
  QVar2.wd.m_i = this_00->rightMargin + QVar1.wd.m_i.m_i + this_00->leftMargin;
  return QVar2;
}

Assistant:

QSize QGridLayout::minimumSize() const
{
    Q_D(const QGridLayout);
    QSize result(d->minimumSize(horizontalSpacing(), verticalSpacing()));
    int left, top, right, bottom;
    d->effectiveMargins(&left, &top, &right, &bottom);
    result += QSize(left + right, top + bottom);
    return result;
}